

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

size_t mpack_expect_utf8(mpack_reader_t *reader,char *buf,size_t size)

{
  _Bool _Var1;
  size_t count;
  
  count = mpack_expect_str_buf(reader,buf,size);
  _Var1 = mpack_utf8_check_impl((uint8_t *)buf,count,true);
  if (!_Var1) {
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
      }
    }
    count = 0;
  }
  return count;
}

Assistant:

size_t mpack_expect_utf8(mpack_reader_t* reader, char* buf, size_t size) {
    mpack_assert(buf != NULL, "buf cannot be NULL");

    size_t length = mpack_expect_str_buf(reader, buf, size);

    if (!mpack_utf8_check(buf, length)) {
        mpack_reader_flag_error(reader, mpack_error_type);
        return 0;
    }

    return length;
}